

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void objini(mcmcxdef *mctx,int sccnt,objnum objn,int classflg)

{
  mcmcxdef *ctx;
  long lVar1;
  int in_ECX;
  ushort in_DX;
  uint in_ESI;
  undefined8 *in_RDI;
  uint flags;
  objdef *o;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  ctx = (mcmcxdef *)
        mcmlck((mcmcxdef *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
               (mcmon)((ulong)in_stack_ffffffffffffffe0 >> 0x30));
  memset(ctx,0,10);
  oswp2((uchar *)((long)&ctx->mcmcxgl + 4),in_ESI);
  oswp2(&ctx->mcmcxflg,in_ESI * 2 + 0xe);
  oswp2((uchar *)((long)&ctx->mcmcxgl + 2),(uint)(in_ECX != 0));
  lVar1 = *(long *)(*(long *)*in_RDI +
                   (long)((int)(uint)*(ushort *)
                                      (in_RDI[(long)((int)(uint)in_DX >> 8) + 6] +
                                      (long)(int)(in_DX & 0xff) * 2) >> 8) * 8) +
          (long)(int)(*(ushort *)
                       (in_RDI[(long)((int)(uint)in_DX >> 8) + 6] + (long)(int)(in_DX & 0xff) * 2) &
                     0xff) * 0x20;
  *(ushort *)(lVar1 + 0x14) = *(ushort *)(lVar1 + 0x14) | 1;
  mcmunlck(ctx,0);
  return;
}

Assistant:

void objini(mcmcxdef *mctx, int sccnt, objnum objn, int classflg)
{
    objdef *o;
    uint    flags = 0;

    /* get a lock on the object */
    o = (objdef *)mcmlck(mctx, objn);
    
    memset(o, 0, (size_t)10);
    objsnsc(o, sccnt);
    objsfree(o, ((uchar *)objsc(o) + 2*sccnt) - (uchar *)o);
    
    /* set up flags */
    if (classflg) flags |= OBJFCLASS;
    objsflg(o, flags);

    /* tell cache manager that this object has been modified */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
}